

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O2

uint32_t spvtools::opt::anon_unknown_0::NegateConstant(ConstantManager *const_mgr,Constant *c)

{
  long *plVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Instruction *pIVar4;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 *puVar5;
  long lVar6;
  Constant *c_00;
  undefined4 extraout_var_05;
  undefined8 *puVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  uint32_t local_54;
  Constant *local_50;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  iVar2 = (*c->type_->_vptr_Type[0xe])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    iVar2 = (*c->type_->_vptr_Type[0xc])();
    if (CONCAT44(extraout_var_02,iVar2) != 0) {
      uVar3 = NegateFloatingPointConstant(const_mgr,c);
      return uVar3;
    }
    iVar2 = (*c->type_->_vptr_Type[10])();
    if (CONCAT44(extraout_var_05,iVar2) != 0) {
      uVar3 = NegateIntegerConstant(const_mgr,c);
      return uVar3;
    }
    __assert_fail("c->type()->AsInteger()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x11a,
                  "uint32_t spvtools::opt::(anonymous namespace)::NegateConstant(analysis::ConstantManager *, const analysis::Constant *)"
                 );
  }
  if (const_mgr == (ConstantManager *)0x0) {
    __assert_fail("const_mgr && c",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0xfa,
                  "uint32_t spvtools::opt::(anonymous namespace)::NegateVectorConstant(analysis::ConstantManager *, const analysis::Constant *)"
                 );
  }
  iVar2 = (*c->type_->_vptr_Type[0xe])();
  if (CONCAT44(extraout_var_00,iVar2) != 0) {
    iVar2 = (*c->_vptr_Constant[0x16])(c);
    if (CONCAT44(extraout_var_01,iVar2) != 0) {
      pIVar4 = analysis::ConstantManager::GetDefiningInstruction(const_mgr,c,0,(inst_iterator *)0x0)
      ;
      uVar3 = Instruction::result_id(pIVar4);
      return uVar3;
    }
    iVar2 = (*c->_vptr_Constant[0x13])(c);
    plVar1 = *(long **)(CONCAT44(extraout_var_03,iVar2) + 0x28);
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50 = c;
    iVar2 = (*c->_vptr_Constant[0x13])(c);
    puVar5 = (undefined8 *)
             (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar2) + 0xc0))
                       ((long *)CONCAT44(extraout_var_04,iVar2));
    puVar7 = (undefined8 *)*puVar5;
    puVar5 = (undefined8 *)puVar5[1];
    do {
      if (puVar7 == puVar5) {
        c_00 = analysis::ConstantManager::GetConstant
                         (const_mgr,local_50->type_,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
        pIVar4 = analysis::ConstantManager::GetDefiningInstruction
                           (const_mgr,c_00,0,(inst_iterator *)0x0);
        uVar3 = Instruction::result_id(pIVar4);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
        return uVar3;
      }
      lVar6 = (**(code **)(*plVar1 + 0x60))(plVar1);
      if (lVar6 == 0) {
        lVar6 = (**(code **)(*plVar1 + 0x50))(plVar1);
        if (lVar6 == 0) {
          __assert_fail("component_type->AsInteger()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                        ,0x107,
                        "uint32_t spvtools::opt::(anonymous namespace)::NegateVectorConstant(analysis::ConstantManager *, const analysis::Constant *)"
                       );
        }
        local_54 = NegateIntegerConstant(const_mgr,(Constant *)*puVar7);
      }
      else {
        local_54 = NegateFloatingPointConstant(const_mgr,(Constant *)*puVar7);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_54);
      puVar7 = puVar7 + 1;
    } while( true );
  }
  __assert_fail("c->type()->AsVector()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                ,0xfb,
                "uint32_t spvtools::opt::(anonymous namespace)::NegateVectorConstant(analysis::ConstantManager *, const analysis::Constant *)"
               );
}

Assistant:

uint32_t NegateConstant(analysis::ConstantManager* const_mgr,
                        const analysis::Constant* c) {
  if (c->type()->AsVector()) {
    return NegateVectorConstant(const_mgr, c);
  } else if (c->type()->AsFloat()) {
    return NegateFloatingPointConstant(const_mgr, c);
  } else {
    assert(c->type()->AsInteger());
    return NegateIntegerConstant(const_mgr, c);
  }
}